

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SpotLight *
pbrt::SpotLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  TVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 extraout_var;
  Transform *this;
  undefined1 auVar4 [16];
  Float FVar5;
  Float totalWidth;
  Float FVar6;
  Float FVar7;
  Float FVar8;
  float fVar9;
  undefined1 extraout_var_00 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Point3f delta;
  Point3f PVar18;
  SpectrumHandle I;
  Transform dirToZ;
  Transform t;
  Transform finalRenderFromLight;
  float local_294;
  undefined1 local_270 [8];
  undefined1 local_268 [80];
  size_t sStack_218;
  RGBColorSpace *pRStack_210;
  Float aFStack_208 [2];
  Float aFStack_200 [2];
  Float aFStack_1f8 [2];
  Float aFStack_1f0 [2];
  undefined1 local_1e8 [16];
  SpectrumHandle local_1d0;
  ulong local_1c8;
  SpectrumHandle local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a8;
  Float aFStack_198 [2];
  Float aFStack_190 [2];
  Float aFStack_188 [2];
  Float aFStack_180 [2];
  ParsedParameter **local_178;
  ParsedParameter *pPStack_170;
  ParsedParameter *pPStack_168;
  ParsedParameter *pPStack_160;
  ParsedParameter *pPStack_158;
  ParsedParameter *pPStack_150;
  ParsedParameter *pPStack_148;
  ParsedParameter *pPStack_140;
  Transform local_130;
  Transform local_b0;
  undefined1 auVar12 [56];
  
  TVar1.bits = (long)local_268 + 0x10;
  local_268._0_8_ = TVar1.bits;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"I","");
  local_1c8 = (ulong)&colorSpace->illuminant | 0x2000000000000;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)local_270,(string *)parameters,(SpectrumHandle *)local_268,
             (SpectrumType)&local_1c8,(Allocator)0x2);
  if (local_268._0_8_ != TVar1.bits) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  local_268._0_8_ = TVar1.bits;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"scale","");
  FVar5 = ParameterDictionary::GetOneFloat(parameters,(string *)local_268,1.0);
  if (local_268._0_8_ != TVar1.bits) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  local_268._0_8_ = TVar1.bits;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"coneangle","");
  totalWidth = ParameterDictionary::GetOneFloat(parameters,(string *)local_268,30.0);
  if (local_268._0_8_ != TVar1.bits) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  local_268._0_8_ = TVar1.bits;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"conedeltaangle","");
  FVar6 = ParameterDictionary::GetOneFloat(parameters,(string *)local_268,5.0);
  auVar12 = extraout_var_00;
  if (local_268._0_8_ != TVar1.bits) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  local_268._0_8_ = TVar1.bits;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"from","");
  local_130.m.m[0][0] = 0.0;
  local_130.m.m[0][1] = 0.0;
  local_130.m.m[0][2] = 0.0;
  delta = ParameterDictionary::GetOnePoint3f(parameters,(string *)local_268,(Point3f *)&local_130);
  auVar10._0_8_ = delta.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  if (local_268._0_8_ != TVar1.bits) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  local_268._0_8_ = TVar1.bits;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"to","");
  local_130.m.m[0][0] = 0.0;
  local_130.m.m[0][1] = 0.0;
  local_130.m.m[0][2] = 1.0;
  PVar18 = ParameterDictionary::GetOnePoint3f(parameters,(string *)local_268,(Point3f *)&local_130);
  auVar11._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar12;
  auVar14 = auVar11._0_16_;
  if (local_268._0_8_ != TVar1.bits) {
    local_1e8 = auVar11._0_16_;
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
    auVar14 = local_1e8;
  }
  auVar2 = vsubps_avx(auVar14,auVar10._0_16_);
  local_130.m.m[2][2] =
       PVar18.super_Tuple3<pbrt::Point3,_float>.z - delta.super_Tuple3<pbrt::Point3,_float>.z;
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  this = &local_130;
  local_130.m.m[0][3] = 0.0;
  local_130.m.m[1][3] = 0.0;
  auVar14._0_4_ = auVar2._0_4_ * auVar2._0_4_;
  auVar14._4_4_ = auVar2._4_4_ * auVar2._4_4_;
  auVar14._8_4_ = auVar2._8_4_ * auVar2._8_4_;
  auVar14._12_4_ = auVar2._12_4_ * auVar2._12_4_;
  auVar14 = vhaddps_avx(auVar14,auVar14);
  auVar14 = ZEXT416((uint)(local_130.m.m[2][2] * local_130.m.m[2][2] + auVar14._0_4_));
  auVar14 = vsqrtss_avx(auVar14,auVar14);
  fVar13 = auVar14._0_4_;
  local_130.m.m[2][2] = local_130.m.m[2][2] / fVar13;
  auVar4._4_4_ = fVar13;
  auVar4._0_4_ = fVar13;
  auVar4._8_4_ = fVar13;
  auVar4._12_4_ = fVar13;
  auVar14 = vdivps_avx(auVar2,auVar4);
  auVar4 = vpternlogd_avx512vl(auVar16,ZEXT416((uint)local_130.m.m[2][2]),auVar17,0xf8);
  fVar13 = auVar4._0_4_;
  fVar9 = auVar14._0_4_;
  local_130.m.m[0][2] = -fVar13 * fVar9;
  fVar15 = -1.0 / (local_130.m.m[2][2] + fVar13);
  auVar2 = vmovshdup_avx(auVar14);
  local_130.m.m[1][2] = auVar2._0_4_;
  local_130.m.m[1][0] = fVar9 * local_130.m.m[1][2] * fVar15;
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 * fVar13 * fVar9)),ZEXT416((uint)fVar15),auVar16);
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)(local_130.m.m[1][2] * local_130.m.m[1][2])),
                           ZEXT416((uint)fVar15),auVar4);
  local_130.m.m[1][2] = -local_130.m.m[1][2];
  local_130.m.m[0][1] = fVar13 * local_130.m.m[1][0];
  local_130.m.m[0][0] = auVar2._0_4_;
  local_130.m.m[1][1] = auVar4._0_4_;
  local_130.m.m[2]._0_8_ = vmovlps_avx(auVar14);
  local_130.m.m._44_16_ = ZEXT816(0) << 0x20;
  local_130.m.m[3][3] = 1.0;
  Transform::Transform((Transform *)local_268,&this->m);
  Translate(&local_b0,(pbrt *)this,(Vector3f)delta.super_Tuple3<pbrt::Point3,_float>);
  local_1b8._0_8_ = local_268._64_8_;
  local_1b8._8_8_ = local_268._72_8_;
  aStack_1a8._M_allocated_capacity = sStack_218;
  aStack_1a8._8_8_ = pRStack_210;
  aFStack_198[0] = aFStack_208[0];
  aFStack_198[1] = aFStack_208[1];
  aFStack_190[0] = aFStack_200[0];
  aFStack_190[1] = aFStack_200[1];
  aFStack_188[0] = aFStack_1f8[0];
  aFStack_188[1] = aFStack_1f8[1];
  aFStack_180[0] = aFStack_1f0[0];
  aFStack_180[1] = aFStack_1f0[1];
  local_178 = (ParsedParameter **)local_268._0_8_;
  pPStack_170 = (ParsedParameter *)local_268._8_8_;
  pPStack_168 = (ParsedParameter *)local_268._16_8_;
  pPStack_160 = (ParsedParameter *)local_268._24_8_;
  pPStack_158 = (ParsedParameter *)local_268._32_8_;
  pPStack_150 = (ParsedParameter *)local_268._40_8_;
  pPStack_148 = (ParsedParameter *)local_268._48_8_;
  pPStack_140 = (ParsedParameter *)local_268._56_8_;
  Transform::operator*(&local_130,&local_b0,(Transform *)local_1b8);
  Transform::operator*(&local_b0,renderFromLight,&local_130);
  local_1d0.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_270;
  FVar7 = SpectrumToPhotometric(&local_1d0);
  local_1b8._0_8_ = &aStack_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"power","");
  FVar8 = ParameterDictionary::GetOneFloat(parameters,(string *)local_1b8,-1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &aStack_1a8) {
    operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
  }
  fVar13 = FVar5 / FVar7;
  if (0.0 < FVar8) {
    fVar9 = cosf(totalWidth * 0.017453292);
    local_1e8._0_4_ = fVar9;
    fVar9 = cosf((totalWidth - FVar6) * 0.017453292);
    fVar13 = fVar13 * (FVar8 / (((1.0 - fVar9) + (fVar9 - (float)local_1e8._0_4_) * 0.5) * 6.2831855
                               ));
  }
  local_294 = totalWidth - FVar6;
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0xd0,8);
  local_1b8._0_8_ =
       (medium->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_1c0.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_270;
  local_1b8._8_8_ = local_1b8._0_8_;
  SpotLight((SpotLight *)CONCAT44(extraout_var,iVar3),&local_b0,(MediumInterface *)local_1b8,
            &local_1c0,fVar13,totalWidth,local_294,alloc);
  return (SpotLight *)CONCAT44(extraout_var,iVar3);
}

Assistant:

SpotLight *SpotLight::Create(const Transform &renderFromLight, MediumHandle medium,
                             const ParameterDictionary &parameters,
                             const RGBColorSpace *colorSpace, const FileLoc *loc,
                             Allocator alloc) {
    SpectrumHandle I = parameters.GetOneSpectrum("I", &colorSpace->illuminant,
                                                 SpectrumType::Illuminant, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Float coneangle = parameters.GetOneFloat("coneangle", 30.);
    Float conedelta = parameters.GetOneFloat("conedeltaangle", 5.);
    // Compute spotlight world to light transformation
    Point3f from = parameters.GetOnePoint3f("from", Point3f(0, 0, 0));
    Point3f to = parameters.GetOnePoint3f("to", Point3f(0, 0, 1));

    Transform dirToZ = (Transform)Frame::FromZ(Normalize(to - from));
    Transform t = Translate(Vector3f(from.x, from.y, from.z)) * Inverse(dirToZ);
    Transform finalRenderFromLight = renderFromLight * t;

    sc /= SpectrumToPhotometric(I);

    Float phi_v = parameters.GetOneFloat("power", -1);
    if (phi_v > 0) {
        Float cosFalloffEnd = std::cos(Radians(coneangle));
        Float cosFalloffStart = std::cos(Radians(coneangle - conedelta));
        Float k_e =
            2 * Pi * ((1 - cosFalloffStart) + (cosFalloffStart - cosFalloffEnd) / 2);
        sc *= phi_v / k_e;
    }

    return alloc.new_object<SpotLight>(finalRenderFromLight, medium, I, sc, coneangle,
                                       coneangle - conedelta, alloc);
}